

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::set_metadata(torrent *this,span<const_char> metadata_buf)

{
  torrent *this_00;
  session_interface *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_class_24_3_1e81adb4 f;
  error_code eVar7;
  bool bVar8;
  int iVar9;
  element_type *peVar10;
  info_hash_t *piVar11;
  char *s;
  session_settings *psVar12;
  alert_manager *paVar13;
  file_storage *this_01;
  int64_t iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<peer_connection_*> *this_02;
  reference pppVar15;
  EVP_PKEY_CTX *ctx;
  shared_ptr<libtorrent::torrent_info> *psVar16;
  span<const_char> buffer;
  int in_stack_fffffffffffffc90;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_23d;
  undefined4 local_23c;
  error_code local_238;
  enable_shared_from_this<libtorrent::aux::torrent> local_228;
  pointer local_218;
  torrent *ptStack_210;
  shared_ptr<libtorrent::torrent_info> *local_208;
  byte local_1fd [8];
  bool failed;
  undefined4 local_1f4;
  error_code local_1f0;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [8];
  shared_ptr<libtorrent::torrent_info> info;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  bdecode_node metadata;
  pointer plStack_168;
  int pos;
  error_code ec;
  info_hash_t old_ih;
  error_code_enum local_11c;
  undefined1 local_118 [16];
  span<const_char> local_108;
  hasher256 local_f8;
  undefined1 local_ec [8];
  sha256_hash info_hash_1;
  op_queue<boost::asio::detail::wait_op> local_a0;
  hasher256 local_90;
  undefined1 local_84 [8];
  sha256_hash info_hash2;
  span<const_char> local_58;
  hasher local_48;
  undefined1 local_3c [8];
  sha1_hash info_hash;
  torrent *this_local;
  span<const_char> metadata_buf_local;
  
  metadata_buf_local.m_ptr = (char *)metadata_buf.m_len;
  this_local = (torrent *)metadata_buf.m_ptr;
  info_hash.m_number._M_elems._12_8_ = this;
  peVar10 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar8 = torrent_info::is_valid(peVar10);
  if (bVar8) {
    metadata_buf_local.m_len._7_1_ = 0;
    goto LAB_00690601;
  }
  peVar10 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  piVar11 = torrent_info::info_hashes(peVar10);
  bVar8 = info_hash_t::has_v1(piVar11);
  if (bVar8) {
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_58,(span<const_char> *)&this_local);
    lcrypto::hasher::hasher(&local_48,local_58);
    lcrypto::hasher::final((sha1_hash *)local_3c,&local_48);
    lcrypto::hasher::~hasher(&local_48);
    peVar10 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    piVar11 = torrent_info::info_hashes(peVar10);
    bVar8 = digest32<160L>::operator!=((digest32<160L> *)local_3c,&piVar11->v1);
    if (bVar8) {
      span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                ((span<char_const> *)&local_a0,(span<const_char> *)&this_local);
      lcrypto::hasher256::hasher256(&local_90,(span<const_char>)local_a0);
      lcrypto::hasher256::final((sha256_hash *)local_84,&local_90);
      lcrypto::hasher256::~hasher256(&local_90);
      s = digest32<256L>::data((digest32<256L> *)local_84);
      digest32<160L>::digest32((digest32<160L> *)&stack0xffffffffffffff4c,s);
      peVar10 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      piVar11 = torrent_info::info_hashes(peVar10);
      bVar8 = digest32<160L>::operator!=((digest32<160L> *)&stack0xffffffffffffff4c,&piVar11->v1);
      if (bVar8) {
        paVar13 = alerts(this);
        bVar8 = alert_manager::should_post<libtorrent::metadata_failed_alert>(paVar13);
        if (bVar8) {
          paVar13 = alerts(this);
          this_00 = (torrent *)(info_hash_1.m_number._M_elems + 7);
          get_handle(this_00);
          info_hash_1.m_number._M_elems[6] = 0x1e;
          alert_manager::
          emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                    (paVar13,(torrent_handle *)this_00,info_hash_1.m_number._M_elems + 6);
          torrent_handle::~torrent_handle((torrent_handle *)(info_hash_1.m_number._M_elems + 7));
        }
        metadata_buf_local.m_len._7_1_ = 0;
        goto LAB_00690601;
      }
    }
  }
  peVar10 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  piVar11 = torrent_info::info_hashes(peVar10);
  bVar8 = info_hash_t::has_v2(piVar11);
  if (bVar8) {
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_108,(span<const_char> *)&this_local);
    lcrypto::hasher256::hasher256(&local_f8,local_108);
    lcrypto::hasher256::final((sha256_hash *)local_ec,&local_f8);
    lcrypto::hasher256::~hasher256(&local_f8);
    peVar10 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    piVar11 = torrent_info::info_hashes(peVar10);
    bVar8 = digest32<256L>::operator!=((digest32<256L> *)local_ec,&piVar11->v2);
    if (bVar8) {
      paVar13 = alerts(this);
      bVar8 = alert_manager::should_post<libtorrent::metadata_failed_alert>(paVar13);
      if (bVar8) {
        paVar13 = alerts(this);
        get_handle((torrent *)local_118);
        local_11c = mismatching_info_hash;
        alert_manager::
        emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                  (paVar13,(torrent_handle *)local_118,&local_11c);
        torrent_handle::~torrent_handle((torrent_handle *)local_118);
      }
      metadata_buf_local.m_len._7_1_ = 0;
      goto LAB_00690601;
    }
  }
  psVar16 = &(this->super_torrent_hot_members).m_torrent_file;
  peVar10 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)psVar16);
  piVar11 = torrent_info::info_hashes(peVar10);
  ec.cat_ = *(error_category **)(piVar11->v1).m_number._M_elems;
  boost::system::error_code::error_code((error_code *)&stack0xfffffffffffffe98);
  metadata._60_4_ = 0;
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)
             &info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(span<const_char> *)&this_local);
  psVar12 = settings(this);
  iVar9 = session_settings::get_int(psVar12,0x4096);
  buffer.m_len = (difference_type)&stack0xfffffffffffffe98;
  buffer.m_ptr = (char *)local_1b8;
  bdecode((bdecode_node *)local_1b0,
          (libtorrent *)
          info.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi,buffer,(error_code *)&metadata.field_0x3c,(int *)0xc8,iVar9,
          in_stack_fffffffffffffc90);
  ::std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)psVar16);
  ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)local_1d0);
  bVar8 = boost::system::error_code::operator_cast_to_bool((error_code *)&stack0xfffffffffffffe98);
  if (bVar8) {
LAB_0069001e:
    update_gauge(this);
    paVar13 = alerts(this);
    bVar8 = alert_manager::should_post<libtorrent::metadata_failed_alert>(paVar13);
    if (bVar8) {
      paVar13 = alerts(this);
      get_handle((torrent *)local_1e0);
      alert_manager::
      emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,boost::system::error_code&>
                (paVar13,(torrent_handle *)local_1e0,(error_code *)&stack0xfffffffffffffe98);
      torrent_handle::~torrent_handle((torrent_handle *)local_1e0);
    }
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_1f0,invalid_swarm_metadata,(type *)0x0);
    local_1f4 = 0xffffffff;
    set_error(this,&local_1f0,(file_index_t)0xffffffff);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)&failed);
    pause(this);
    metadata_buf_local.m_len._7_1_ = 0;
  }
  else {
    peVar10 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1d0);
    psVar12 = settings(this);
    iVar9 = session_settings::get_int(psVar12,0x4095);
    bVar8 = torrent_info::parse_info_section
                      (peVar10,(bdecode_node *)local_1b0,(error_code *)&stack0xfffffffffffffe98,
                       iVar9);
    if (!bVar8) goto LAB_0069001e;
    local_1fd[0] = 0;
    peVar10 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1d0);
    piVar11 = torrent_info::info_hashes(peVar10);
    local_218 = (pointer)local_1fd;
    local_208 = (shared_ptr<libtorrent::torrent_info> *)local_1d0;
    f.this._0_4_ = (int)this;
    f.failed = (bool *)local_218;
    f.this._4_4_ = (int)((ulong)this >> 0x20);
    f.info = local_208;
    ptStack_210 = this;
    info_hash_t::for_each<libtorrent::aux::torrent::set_metadata(libtorrent::span<char_const>)::__0>
              (piVar11,f);
    eVar7.cat_ = local_238.cat_;
    eVar7.val_ = local_238.val_;
    eVar7.failed_ = local_238.failed_;
    eVar7._5_3_ = local_238._5_3_;
    if ((local_1fd[0] & 1) == 0) {
      if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
        psVar16 = &(this->super_torrent_hot_members).m_torrent_file;
        ::std::shared_ptr<libtorrent::torrent_info>::operator=
                  (psVar16,(shared_ptr<libtorrent::torrent_info> *)local_1d0);
        peVar10 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)psVar16);
        piVar11 = torrent_info::info_hashes(peVar10);
        (this->m_info_hash).v2.m_number._M_elems[7] = (piVar11->v2).m_number._M_elems[7];
        uVar2 = *(undefined8 *)(piVar11->v1).m_number._M_elems;
        uVar3 = *(undefined8 *)((piVar11->v1).m_number._M_elems + 2);
        uVar4 = *(undefined8 *)((piVar11->v1).m_number._M_elems + 4);
        uVar5 = *(undefined8 *)((piVar11->v2).m_number._M_elems + 1);
        uVar6 = *(undefined8 *)((piVar11->v2).m_number._M_elems + 5);
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) =
             *(undefined8 *)((piVar11->v2).m_number._M_elems + 3);
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar6;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar4;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar5;
        *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems = uVar2;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar3;
        peVar10 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        this_01 = torrent_info::files(peVar10);
        iVar14 = file_storage::size_on_disk(this_01);
        (this->super_torrent_hot_members).m_size_on_disk = iVar14;
        psVar1 = (this->super_torrent_hot_members).m_ses;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_228);
        ctx = (EVP_PKEY_CTX *)&local_228;
        (*(psVar1->super_session_logger)._vptr_session_logger[0x1a])(psVar1,ctx,&ec.cat_);
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)&local_228);
        local_238 = initialize_merkle_trees(this);
        ec._0_8_ = local_238.cat_;
        plStack_168 = local_238._0_8_;
        bVar8 = boost::system::error_code::operator_cast_to_bool
                          ((error_code *)&stack0xfffffffffffffe98);
        if (bVar8) {
          local_23c = 0xfffffffc;
          set_error(this,(error_code *)&stack0xfffffffffffffe98,(file_index_t)0xfffffffc);
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
          bitfield_flag(&local_23d);
          pause(this);
          metadata_buf_local.m_len._7_1_ = 0;
        }
        else {
          update_gauge(this);
          update_want_tick(this);
          iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          bVar8 = alert_manager::should_post<libtorrent::metadata_received_alert>
                            ((alert_manager *)CONCAT44(extraout_var,iVar9));
          if (bVar8) {
            iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)&__range2);
            ctx = (EVP_PKEY_CTX *)&__range2;
            alert_manager::
            emplace_alert<libtorrent::metadata_received_alert,libtorrent::torrent_handle>
                      ((alert_manager *)CONCAT44(extraout_var_00,iVar9),(torrent_handle *)ctx);
            torrent_handle::~torrent_handle((torrent_handle *)&__range2);
          }
          init(this,ctx);
          peVar10 = ::std::
                    __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&(this->super_torrent_hot_members).m_torrent_file);
          iVar9 = torrent_info::num_pieces(peVar10);
          inc_stats_counter(this,0x6e,iVar9);
          this_02 = &(this->super_torrent_hot_members).m_connections;
          __end2 = ::std::
                   vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ::begin(&this_02->
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          );
          p = (peer_connection *)
              ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::end(&this_02->
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
          while( true ) {
            bVar8 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                        *)&p);
            if (!bVar8) break;
            pppVar15 = __gnu_cxx::
                       __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       ::operator*(&__end2);
            peer_connection::disconnect_if_redundant(*pppVar15);
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
            ::operator++(&__end2);
          }
          set_need_save_resume(this,(resume_data_flags_t)0x80);
          metadata_buf_local.m_len._7_1_ = 1;
        }
      }
      else {
        metadata_buf_local.m_len._7_1_ = 1;
        local_238 = eVar7;
      }
    }
    else {
      metadata_buf_local.m_len._7_1_ = 1;
    }
  }
  local_1fd[1] = 1;
  local_1fd[2] = 0;
  local_1fd[3] = 0;
  local_1fd[4] = 0;
  ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
            ((shared_ptr<libtorrent::torrent_info> *)local_1d0);
  bdecode_node::~bdecode_node((bdecode_node *)local_1b0);
LAB_00690601:
  return (bool)(metadata_buf_local.m_len._7_1_ & 1);
}

Assistant:

bool torrent::set_metadata(span<char const> metadata_buf)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_torrent_file->is_valid()) return false;

		if (m_torrent_file->info_hashes().has_v1())
		{
			sha1_hash const info_hash = hasher(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v1)
			{
				// check if the v1 hash is a truncated v2 hash
				sha256_hash const info_hash2 = hasher256(metadata_buf).final();
				if (sha1_hash(info_hash2.data()) != m_torrent_file->info_hashes().v1)
				{
					if (alerts().should_post<metadata_failed_alert>())
					{
						alerts().emplace_alert<metadata_failed_alert>(get_handle()
							, errors::mismatching_info_hash);
					}
					return false;
				}
			}
		}
		if (m_torrent_file->info_hashes().has_v2())
		{
			// we don't have to worry about computing the v2 hash twice because
			// if the v1 hash was a truncated v2 hash then the torrent_file should
			// not have a v2 hash and we shouldn't get here
			sha256_hash const info_hash = hasher256(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v2)
			{
				if (alerts().should_post<metadata_failed_alert>())
				{
					alerts().emplace_alert<metadata_failed_alert>(get_handle()
						, errors::mismatching_info_hash);
				}
				return false;
			}
		}

		// the torrent's info hash might change
		// e.g. it could be a hybrid torrent which we only had one of the hashes for
		// so remove the existing entry
		info_hash_t const old_ih = m_torrent_file->info_hashes();

		error_code ec;
		int pos = 0;
		bdecode_node const metadata = bdecode(metadata_buf, ec, &pos, 200
			, settings().get_int(settings_pack::metadata_token_limit));

		auto info = std::make_shared<torrent_info>(*m_torrent_file);
		if (ec || !info->parse_info_section(metadata, ec
			, settings().get_int(settings_pack::max_piece_count)))
		{
			update_gauge();
			// this means the metadata is correct, since we
			// verified it against the info-hash, but we
			// failed to parse it. Pause the torrent
			if (alerts().should_post<metadata_failed_alert>())
			{
				alerts().emplace_alert<metadata_failed_alert>(get_handle(), ec);
			}
			set_error(errors::invalid_swarm_metadata, torrent_status::error_file_none);
			pause();
			return false;
		}

		// we might already have this torrent in the session.
		bool failed = false;
		info->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			if (failed) return;

			auto t = m_ses.find_torrent(info_hash_t(ih)).lock();
			if (t && t != shared_from_this())
			{
				TORRENT_ASSERT(!t->valid_metadata());

				// if we get a collision, both torrents fail and have to be
				// removed. This is because updating the info_hash_t for this
				// torrent would conflict with torrent "t". That would violate
				// the invariants:
				//   1. an info-hash can only refer to a single torrent
				//   2. every torrent needs at least one info-hash.
				t->set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				t->pause();

				set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				pause();
				failed = true;

				if (alerts().should_post<torrent_conflict_alert>())
				{
					alerts().emplace_alert<torrent_conflict_alert>(get_handle()
						, torrent_handle(std::move(t)), std::move(info));
				}
			}
		});

		if (failed) return true;
		if (m_abort) return true;

		m_torrent_file = info;
		m_info_hash = m_torrent_file->info_hashes();

		m_size_on_disk = m_torrent_file->files().size_on_disk();

		m_ses.update_torrent_info_hash(shared_from_this(), old_ih);

		ec = initialize_merkle_trees();
		if (ec)
		{
			set_error(ec, torrent_status::error_file_metadata);
			pause();
			return false;
		}

		update_gauge();
		update_want_tick();

		if (m_ses.alerts().should_post<metadata_received_alert>())
		{
			m_ses.alerts().emplace_alert<metadata_received_alert>(
				get_handle());
		}

		// we have to initialize the torrent before we start
		// disconnecting redundant peers, otherwise we'll think
		// we're a seed, because we have all 0 pieces
		init();

		inc_stats_counter(counters::num_total_pieces_added
			, m_torrent_file->num_pieces());

		// disconnect redundant peers
		for (auto* p : m_connections)
			p->disconnect_if_redundant();

		set_need_save_resume(torrent_handle::if_metadata_changed);

		return true;
	}